

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O2

size_t __thiscall
so_5::disp::reuse::work_thread::demand_queue_details::
queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
::demands_count(queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
                *this,demands_counter_t *external_counter)

{
  lock_t *plVar1;
  __int_type _Var2;
  size_type sVar3;
  
  plVar1 = (this->super_no_activity_tracking_impl_t).super_common_data_t.m_lock._M_t.
           super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
           .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl;
  (*plVar1->_vptr_lock_t[2])(plVar1);
  sVar3 = std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::size
                    ((deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_> *)
                     &this->super_no_activity_tracking_impl_t);
  _Var2 = (external_counter->super___atomic_base<unsigned_long>)._M_i;
  (*plVar1->_vptr_lock_t[3])(plVar1);
  return sVar3 + _Var2;
}

Assistant:

std::size_t
	demands_count( const demands_counter_t & external_counter )
	{
		queue_traits::lock_guard_t lock{ *(this->m_lock) };

		return this->m_demands.size()
				+ external_counter.load( std::memory_order_acquire );
	}